

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void errline(int n,int k,FILE *err)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  long local_28;
  size_t spcnt;
  int i;
  FILE *err_local;
  int k_local;
  int n_local;
  
  if (*argv != (char *)0x0) {
    fprintf((FILE *)err,"%s",*argv);
  }
  sVar1 = strlen(*argv);
  local_28 = (long)((int)sVar1 + 1);
  spcnt._4_4_ = 1;
  while( true ) {
    bVar3 = false;
    if (spcnt._4_4_ < n) {
      bVar3 = argv[spcnt._4_4_] != (char *)0x0;
    }
    if (!bVar3) break;
    fprintf((FILE *)err," %s",argv[spcnt._4_4_]);
    sVar1 = strlen(argv[spcnt._4_4_]);
    local_28 = ((int)sVar1 + 1) + local_28;
    spcnt._4_4_ = spcnt._4_4_ + 1;
  }
  uVar2 = k + local_28;
  for (; argv[spcnt._4_4_] != (char *)0x0; spcnt._4_4_ = spcnt._4_4_ + 1) {
    fprintf((FILE *)err," %s",argv[spcnt._4_4_]);
  }
  if (uVar2 < 0x14) {
    fprintf((FILE *)err,"\n%*s^-- here\n",uVar2 & 0xffffffff,"");
  }
  else {
    fprintf((FILE *)err,"\n%*shere --^\n",(ulong)((int)uVar2 - 7),"");
  }
  return;
}

Assistant:

static void errline(int n, int k, FILE *err)
{
  int i;
  size_t spcnt;
  if( argv[0] ) fprintf(err,"%s",argv[0]);
  spcnt = lemonStrlen(argv[0]) + 1;
  for(i=1; i<n && argv[i]; i++){
    fprintf(err," %s",argv[i]);
    spcnt += lemonStrlen(argv[i])+1;
  }
  spcnt += k;
  for(; argv[i]; i++) fprintf(err," %s",argv[i]);
  if( spcnt<20 ){
    fprintf(err,"\n%*s^-- here\n",(int)spcnt,"");
  }else{
    fprintf(err,"\n%*shere --^\n",(int)spcnt-7,"");
  }
}